

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GetNameTest.cpp
# Opt level: O1

int __thiscall
GetNameTest::SubmitRecord(GetNameTest *this,uint8_t *packet,uint32_t length,uint32_t start)

{
  int iVar1;
  
  iVar1 = SubmitName(this,packet,length,start);
  if ((iVar1 + 10U <= length) &&
     (iVar1 + (uint)CONCAT11(packet[iVar1 + 8],packet[iVar1 + 9]) + 10 <= length)) {
    length = iVar1 + (uint)CONCAT11(packet[iVar1 + 8],packet[iVar1 + 9]) + 10;
  }
  return length;
}

Assistant:

int GetNameTest::SubmitRecord(uint8_t * packet, uint32_t length, uint32_t start)
{
    int ldata = 0;

    /* Labels are only tabulated in responses, to avoid polluting data with erroneous packets */
    start = SubmitName(packet, length, start);

    if ((start + 10) > length)
    {
        start = length;
    }
    else
    {
        ldata = (packet[start + 8] << 8) | packet[start + 9];

        if (start + ldata + 10 > length)
        {
            start = length;
        }
        else
        {
            start += ldata + 10;
        }
    }

    return start;
}